

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobj.cpp
# Opt level: O1

void test_receive_proc(Am_Connection *my_connection_ptr)

{
  long *plVar1;
  ulong uVar2;
  Am_Object sent_obj;
  Am_Value val;
  Am_Object local_20;
  Am_Value local_18 [16];
  
  Am_Connection::Receive();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testnobj:Received ",0x12);
  plVar1 = (long *)operator<<((ostream *)&std::cout,local_18);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::ostream::flush();
  Am_Object::Am_Object(&local_20,local_18);
  uVar2 = Am_Object::Get((ushort)&local_20,0x65);
  Am_Object::Set(0x5238,(Am_Value *)0x65,uVar2);
  uVar2 = Am_Object::Get((ushort)&local_20,100);
  Am_Object::Set(0x5238,(Am_Value *)0x64,uVar2);
  Am_Object::~Am_Object(&local_20);
  Am_Value::~Am_Value(local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Receive_Method, void, test_receive,
                 (Am_Connection * my_connection_ptr))
{
  Am_Value val = my_connection_ptr->Receive();
  cout << "testnobj:Received " << val << endl << flush;

  Am_Object sent_obj = (Am_Object)val;
  rectangle.Set(Am_TOP, sent_obj.Get(Am_TOP));
  rectangle.Set(Am_LEFT, sent_obj.Get(Am_LEFT));
}